

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalTexture1DShadowProjOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float lod;
  int offset;
  float *pfVar4;
  float fVar5;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  pfVar4 = tcu::Vector<float,_4>::z(c->in);
  fVar5 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::w(c->in);
  fVar1 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::x(c->in);
  fVar2 = *pfVar4;
  pfVar4 = tcu::Vector<float,_4>::w(c->in);
  fVar3 = *pfVar4;
  lod = p->lod;
  offset = tcu::Vector<int,_3>::x(&p->offset);
  fVar5 = texture1DShadowOffset(c,fVar5 / fVar1,fVar2 / fVar3,lod,offset);
  pfVar4 = tcu::Vector<float,_4>::x(&c->color);
  *pfVar4 = fVar5;
  return;
}

Assistant:

static void		evalTexture1DShadowProjOffset		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture1DShadowOffset(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), p.lod, p.offset.x()); }